

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O0

void move_to_central_cache(ThreadCache *tc,uint sizeClass)

{
  uint uVar1;
  CentralCache *cc_00;
  CentralCache *cc;
  uint sizeClass_local;
  ThreadCache *tc_local;
  
  init_pthread_destructor();
  uVar1 = batch_size(sizeClass);
  tc->counter = uVar1;
  if (tc->tempList != (FreeBlock *)0x0) {
    cc_00 = centralCache + sizeClass;
    spinlock_acquire(&cc_00->lock);
    add_batch_to_central_cache(cc_00,sizeClass,tc->tempList);
    cc_00->lock = 0;
  }
  tc->tempList = tc->freeList;
  tc->freeList = (FreeBlock *)0x0;
  return;
}

Assistant:

static LTALLOC_NOINLINE void move_to_central_cache(ThreadCache* tc, unsigned int sizeClass)
{
	init_pthread_destructor();//needed for cases when freed memory was allocated in the other thread and no alloc was called in this thread till its termination

	tc->counter = batch_size(sizeClass);
	if (tc->tempList)//move temp list to the central cache
	{
		CentralCache* cc = &centralCache[sizeClass];
		SPINLOCK_ACQUIRE(&cc->lock);
		add_batch_to_central_cache(cc, sizeClass, tc->tempList);
		SPINLOCK_RELEASE(&cc->lock);
	}
	// 	else if (unlikely(!tc->freeList))//this is a first call (i.e. when counter = 0) - just initialization of counter needed
	// 	{
	// 		tc->counter--;
	// 		return;
	// 	}

	tc->tempList = tc->freeList;
	tc->freeList = NULL;
}